

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O3

void __thiscall pool_layer_t::calc_grads(pool_layer_t *this,tensor_t<float> *grad_next_layer)

{
  float fVar1;
  bool bVar2;
  undefined8 uVar3;
  int iVar4;
  float *pfVar5;
  int iVar6;
  int _x;
  int x;
  tensor_t<float> *this_00;
  int iVar7;
  int _y;
  int iVar8;
  float fVar9;
  range_t rn;
  range_t local_70;
  tensor_t<float> *local_58;
  pool_layer_t *local_50;
  tensor_t<float> *local_48;
  tensor_t<float> *local_40;
  tensor_t<float> *local_38;
  
  iVar8 = (this->super_layer_t).in.size.x;
  if (0 < iVar8) {
    local_40 = &(this->super_layer_t).in;
    this_00 = &(this->super_layer_t).out;
    local_58 = &(this->super_layer_t).grads_in;
    iVar7 = (this->super_layer_t).in.size.y;
    x = 0;
    local_50 = this;
    local_48 = this_00;
    local_38 = grad_next_layer;
    do {
      if (0 < iVar7) {
        iVar8 = 0;
        do {
          map_to_output(&local_70,this,x,iVar8);
          if (0 < (this->super_layer_t).in.size.z) {
            iVar7 = 0;
            do {
              fVar9 = 0.0;
              _x = local_70.min_x;
              iVar4 = local_70.max_x;
              iVar6 = local_70.max_y;
              fVar1 = 0.0;
              if (local_70.min_x <= local_70.max_x) {
                do {
                  fVar9 = fVar1;
                  _y = local_70.min_y;
                  if (local_70.min_y <= iVar6) {
                    do {
                      pfVar5 = tensor_t<float>::get(local_40,x,iVar8,iVar7);
                      fVar1 = *pfVar5;
                      pfVar5 = tensor_t<float>::get(this_00,_x,_y,iVar7);
                      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar5),0);
                      pfVar5 = tensor_t<float>::get(local_38,_x,_y,iVar7);
                      fVar9 = (float)((uint)((byte)uVar3 & 1) * (int)*pfVar5) + fVar9;
                      bVar2 = _y < local_70.max_y;
                      iVar4 = local_70.max_x;
                      iVar6 = local_70.max_y;
                      _y = _y + 1;
                    } while (bVar2);
                  }
                  bVar2 = _x < iVar4;
                  _x = _x + 1;
                  fVar1 = fVar9;
                } while (bVar2);
              }
              pfVar5 = tensor_t<float>::get(local_58,x,iVar8,iVar7);
              *pfVar5 = fVar9;
              iVar7 = iVar7 + 1;
              this = local_50;
            } while (iVar7 < (local_50->super_layer_t).in.size.z);
          }
          iVar8 = iVar8 + 1;
          iVar7 = (this->super_layer_t).in.size.y;
        } while (iVar8 < iVar7);
        iVar8 = (this->super_layer_t).in.size.x;
      }
      x = x + 1;
    } while (x < iVar8);
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    for (int x = 0; x < in.size.x; x++) {
      for (int y = 0; y < in.size.y; y++) {
        range_t rn = map_to_output(x, y);
        for (int z = 0; z < in.size.z; z++) {
          float sum_error = 0;
          for (int i = rn.min_x; i <= rn.max_x; i++) {
            int minx = i * stride;
            for (int j = rn.min_y; j <= rn.max_y; j++) {
              int miny = j * stride;

              int is_max = in(x, y, z) == out(i, j, z) ? 1 : 0;
              sum_error += is_max * grad_next_layer(i, j, z);
            }
          }
          grads_in(x, y, z) = sum_error;
        }
      }
    }
  }